

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int glfwUpdateGamepadMappings(char *string)

{
  char cVar1;
  undefined1 *puVar2;
  undefined1 uVar3;
  int iVar4;
  ushort **ppuVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  _GLFWmapping *p_Var9;
  char *pcVar10;
  byte bVar11;
  char *__s1;
  char *__s;
  long lVar12;
  char *local_670;
  _GLFWmapping mapping;
  char *local_598 [3];
  _GLFWmapelement *local_580;
  char *local_578;
  _GLFWmapelement *local_570;
  char *local_568;
  _GLFWmapelement *local_560;
  char *local_558;
  _GLFWmapelement *local_550;
  char *local_548;
  _GLFWmapelement *local_540;
  char *local_538;
  _GLFWmapelement *local_530;
  char *local_528;
  _GLFWmapelement *local_520;
  char *local_518;
  _GLFWmapelement *local_510;
  char *local_508;
  _GLFWmapelement *local_500;
  char *local_4f8;
  _GLFWmapelement *local_4f0;
  char *local_4e8;
  _GLFWmapelement *local_4e0;
  char *local_4d8;
  _GLFWmapelement *local_4d0;
  char *local_4c8;
  _GLFWmapelement *local_4c0;
  char *local_4b8;
  _GLFWmapelement *local_4b0;
  char *local_4a8;
  _GLFWmapelement *local_4a0;
  char *local_498;
  _GLFWmapelement *local_490;
  char *local_488;
  _GLFWmapelement *local_480;
  char *local_478;
  _GLFWmapelement *local_470;
  char *local_468;
  _GLFWmapelement *local_460;
  char *local_458;
  _GLFWmapelement *local_450;
  char *local_448;
  _GLFWmapelement *local_440;
  char line [1024];
  
  if (string == (char *)0x0) {
    __assert_fail("string != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x41e,"int glfwUpdateGamepadMappings(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar4 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    for (; cVar1 = *string, (long)cVar1 != 0; string = string + (long)__s) {
      ppuVar5 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x10) == 0) {
        sVar6 = strcspn(string,"\r\n");
        __s = string + sVar6;
        string = (char *)strspn(__s,"\r\n");
      }
      else {
        __s = (char *)strcspn(string,"\r\n");
        if (__s < (char *)0x400) {
          memset(&mapping,0,0xcb);
          memcpy(line,string,(size_t)__s);
          local_598[0] = "platform";
          local_598[1] = (char *)0x0;
          line[(long)__s] = '\0';
          local_598[2] = "a";
          local_580 = mapping.buttons;
          local_578 = "b";
          local_570 = mapping.buttons + 1;
          local_568 = "x";
          local_560 = mapping.buttons + 2;
          local_558 = "y";
          local_550 = mapping.buttons + 3;
          local_548 = "back";
          local_540 = mapping.buttons + 6;
          local_538 = "start";
          local_530 = mapping.buttons + 7;
          local_528 = "guide";
          local_520 = mapping.buttons + 8;
          local_518 = "leftshoulder";
          local_510 = mapping.buttons + 4;
          local_508 = "rightshoulder";
          local_500 = mapping.buttons + 5;
          local_4f8 = "leftstick";
          local_4f0 = mapping.buttons + 9;
          local_4e8 = "rightstick";
          local_4e0 = mapping.buttons + 10;
          local_4d8 = "dpup";
          local_4d0 = mapping.buttons + 0xb;
          local_4c8 = "dpright";
          local_4c0 = mapping.buttons + 0xc;
          local_4b8 = "dpdown";
          local_4b0 = mapping.buttons + 0xd;
          local_4a8 = "dpleft";
          local_4a0 = mapping.buttons + 0xe;
          local_498 = "lefttrigger";
          local_490 = mapping.axes + 4;
          local_488 = "righttrigger";
          local_480 = mapping.axes + 5;
          local_478 = "leftx";
          local_470 = mapping.axes;
          local_468 = "lefty";
          local_460 = mapping.axes + 1;
          local_458 = "rightx";
          local_450 = mapping.axes + 2;
          local_448 = "righty";
          local_440 = mapping.axes + 3;
          local_670 = line;
          sVar6 = strcspn(line,",");
          if ((sVar6 == 0x20) && (line[0x20] == ',')) {
            mapping.guid[0x10] = line[0x10];
            mapping.guid[0x11] = line[0x11];
            mapping.guid[0x12] = line[0x12];
            mapping.guid[0x13] = line[0x13];
            mapping.guid[0x14] = line[0x14];
            mapping.guid[0x15] = line[0x15];
            mapping.guid[0x16] = line[0x16];
            mapping.guid[0x17] = line[0x17];
            mapping.guid[0x18] = line[0x18];
            mapping.guid[0x19] = line[0x19];
            mapping.guid[0x1a] = line[0x1a];
            mapping.guid[0x1b] = line[0x1b];
            mapping.guid[0x1c] = line[0x1c];
            mapping.guid[0x1d] = line[0x1d];
            mapping.guid[0x1e] = line[0x1e];
            mapping.guid[0x1f] = line[0x1f];
            mapping.guid[0] = line[0];
            mapping.guid[1] = line[1];
            mapping.guid[2] = line[2];
            mapping.guid[3] = line[3];
            mapping.guid[4] = line[4];
            mapping.guid[5] = line[5];
            mapping.guid[6] = line[6];
            mapping.guid[7] = line[7];
            mapping.guid[8] = line[8];
            mapping.guid[9] = line[9];
            mapping.guid[10] = line[10];
            mapping.guid[0xb] = line[0xb];
            mapping.guid[0xc] = line[0xc];
            mapping.guid[0xd] = line[0xd];
            mapping.guid[0xe] = line[0xe];
            mapping.guid[0xf] = line[0xf];
            sVar6 = strcspn(line + 0x21,",");
            if ((sVar6 < 0x80) && (line[sVar6 + 0x21] == ',')) {
              memcpy(&mapping,line + 0x21,sVar6);
              __s1 = line + sVar6 + 0x22;
              while (local_670 = __s1, *__s1 != '\0') {
                for (lVar12 = 8; pcVar10 = __s1, lVar12 != 0x168; lVar12 = lVar12 + 0x10) {
                  pcVar10 = *(char **)(&mapping.axes[2].type + lVar12);
                  sVar6 = strlen(pcVar10);
                  iVar4 = strncmp(__s1,pcVar10,sVar6);
                  if ((iVar4 == 0) && (__s1[sVar6] == ':')) {
                    pcVar10 = __s1 + sVar6 + 1;
                    puVar2 = *(undefined1 **)((long)local_598 + lVar12);
                    local_670 = pcVar10;
                    if (puVar2 == (undefined1 *)0x0) {
                      iVar4 = strncmp(pcVar10,"Linux",5);
                      if (iVar4 != 0) goto LAB_0013ec2e;
                      break;
                    }
                    cVar1 = *pcVar10;
                    if (cVar1 == 'a') {
                      uVar3 = 1;
LAB_0013ebea:
                      *puVar2 = uVar3;
                      uVar8 = strtoul(__s1 + sVar6 + 2,&local_670,10);
                      bVar11 = (byte)uVar8;
                    }
                    else {
                      if (cVar1 != 'h') {
                        if (cVar1 == 'b') {
                          uVar3 = 2;
                          goto LAB_0013ebea;
                        }
                        break;
                      }
                      *puVar2 = 3;
                      uVar8 = strtoul(__s1 + sVar6 + 2,&local_670,10);
                      uVar7 = strtoul(local_670 + 1,&local_670,10);
                      bVar11 = (byte)(uVar8 << 4) | (byte)uVar7;
                    }
                    puVar2[1] = bVar11;
                    pcVar10 = local_670;
                    break;
                  }
                }
                sVar6 = strcspn(pcVar10,",");
                pcVar10 = pcVar10 + sVar6;
                local_670 = pcVar10;
                sVar6 = strspn(pcVar10,",");
                __s1 = pcVar10 + sVar6;
              }
              for (lVar12 = 0x80; lVar12 != 0xa0; lVar12 = lVar12 + 1) {
                if ((byte)(mapping.name[lVar12] + 0xbfU) < 6) {
                  mapping.name[lVar12] = mapping.name[lVar12] | 0x20;
                }
              }
              _glfwPlatformUpdateGamepadGUID(mapping.guid);
              p_Var9 = findMapping(mapping.guid);
              if (p_Var9 == (_GLFWmapping *)0x0) {
                lVar12 = (long)_glfw.mappingCount;
                _glfw.mappingCount = (int)(lVar12 + 1);
                _glfw.mappings = (_GLFWmapping *)realloc(_glfw.mappings,(lVar12 + 1) * 0xcb);
                p_Var9 = _glfw.mappings + (long)_glfw.mappingCount + -1;
              }
              memcpy(p_Var9,&mapping,0xcb);
              goto LAB_0013ec2e;
            }
          }
          _glfwInputError(0x10004,(char *)0x0);
        }
      }
LAB_0013ec2e:
    }
    iVar4 = 1;
    for (lVar12 = 0; lVar12 != 0x1fa00; lVar12 = lVar12 + 0x1fa0) {
      if (*(int *)(_glfw.joysticks[0].guid + lVar12 + -0x48) != 0) {
        p_Var9 = findValidMapping((_GLFWjoystick *)(_glfw.joysticks[0].guid + lVar12 + -0x48));
        *(_GLFWmapping **)(_glfw.joysticks[0].linjs.path + lVar12 + -0xc) = p_Var9;
      }
    }
  }
  return iVar4;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if (isxdigit(*c))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}